

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_spin_flip.hpp
# Opt level: O2

void openjij::updater::
     SingleFlipUpdater<openjij::system::SASystem<openjij::graph::IsingPolynomialModel<double>,openjij::utility::Xorshift>,openjij::utility::Xorshift>
               (SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>
                *system,int32_t num_sweeps,vector<double,_std::allocator<double>_> *beta_list,
               result_type seed,UpdateMethod update_metod)

{
  double dVar1;
  uint uVar2;
  runtime_error *this;
  ulong uVar3;
  int32_t i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  result_type_conflict3 rVar8;
  Xorshift random_number_engine;
  uniform_real_distribution<double> local_48;
  
  uVar2 = system->system_size_;
  random_number_engine.x = 0x75bcd15;
  random_number_engine.y = 0x159a55e5;
  random_number_engine.z = 0x1f123bb5;
  random_number_engine.w = (uint)seed;
  local_48._M_param._M_a = 0.0;
  local_48._M_param._M_b = 1.0;
  if (update_metod == METROPOLIS) {
    uVar6 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar6;
    }
    uVar5 = (ulong)(uint)num_sweeps;
    if (num_sweeps < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      dVar1 = (beta_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar7 = (double)((system->sample_).
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4] * -2) *
                (system->base_energy_difference_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4];
        if (dVar7 <= 0.0) {
LAB_00166c4b:
          openjij::system::
          SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>::Flip
                    (system,(int32_t)uVar4);
        }
        else {
          dVar7 = exp(dVar7 * -dVar1);
          rVar8 = std::uniform_real_distribution<double>::operator()
                            (&local_48,&random_number_engine);
          if (rVar8 < dVar7) goto LAB_00166c4b;
        }
      }
    }
  }
  else {
    if (update_metod != HEAT_BATH) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown UpdateMethod");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar6;
    }
    uVar5 = (ulong)(uint)num_sweeps;
    if (num_sweeps < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      dVar1 = (beta_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar7 = exp((double)((system->sample_).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar4] * -2) *
                    (system->base_energy_difference_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4] * dVar1);
        rVar8 = std::uniform_real_distribution<double>::operator()(&local_48,&random_number_engine);
        if (rVar8 < 1.0 / (dVar7 + 1.0)) {
          openjij::system::
          SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>::Flip
                    (system,(int32_t)uVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void SingleFlipUpdater(SystemType *system,
                       const std::int32_t num_sweeps,
                       const std::vector<typename SystemType::ValueType> &beta_list,
                       const typename RandType::result_type seed,
                       const algorithm::UpdateMethod update_metod) {
   
   const std::int32_t system_size = system->GetSystemSize();
   
   // Set random number engine
   RandType random_number_engine(seed);
   std::uniform_real_distribution<typename SystemType::ValueType> dist_real(0, 1);
   
   if (update_metod == algorithm::UpdateMethod::METROPOLIS) {
      // Do sequential update
      for (std::int32_t sweep_count = 0; sweep_count < num_sweeps; sweep_count++) {
         const auto beta = beta_list[sweep_count];
         for (std::int32_t i = 0; i < system_size; i++) {
            const auto delta_energy = system->GetEnergyDifference(i);
            if (delta_energy <= 0 || std::exp(-beta*delta_energy) > dist_real(random_number_engine)) {
               system->Flip(i);
            }
         }
      }
   }
   else if (update_metod == algorithm::UpdateMethod::HEAT_BATH) {
      // Do sequential update
      for (std::int32_t sweep_count = 0; sweep_count < num_sweeps; sweep_count++) {
         const auto beta = beta_list[sweep_count];
         for (std::int32_t i = 0; i < system_size; i++) {
            const auto delta_energy = system->GetEnergyDifference(i);
            if (1/(1 + std::exp(beta*delta_energy)) > dist_real(random_number_engine)) {
               system->Flip(i);
            }
         }
      }
   }
   else {
      throw std::runtime_error("Unknown UpdateMethod");
   }
}